

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

bool __thiscall flatbuffers::rust::RustGenerator::GenerateOneFile(RustGenerator *this)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumDef *enum_def;
  Namespace *pNVar2;
  StructDef *pSVar3;
  bool bVar4;
  char *__s;
  long *plVar5;
  Parser *pPVar6;
  size_type *psVar7;
  pointer ppEVar8;
  pointer ppSVar9;
  StructDef *struct_def;
  Namespace **ns;
  pointer ppNVar10;
  string file_path;
  string final_code;
  allocator<char> local_d1;
  string local_d0;
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  __s = BaseGenerator::FlatBuffersGeneratedWarning();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_d1);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x36de3f);
  paVar1 = &local_d0.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_d0.field_2._M_allocated_capacity = *psVar7;
    local_d0.field_2._8_8_ = plVar5[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar7;
    local_d0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90.field_2._8_8_ = plVar5[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_90._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"// @generated","");
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this->cur_name_space_ == (Namespace *)0x0) {
    GenNamespaceImports(this,0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    CodeWriter::operator+=(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pPVar6 = (this->super_BaseGenerator).parser_;
    for (ppNVar10 = (pPVar6->namespaces_).
                    super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppNVar10 !=
        (pPVar6->namespaces_).
        super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppNVar10 = ppNVar10 + 1) {
      for (ppEVar8 = (pPVar6->enums_).vec.
                     super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pPVar6 = (this->super_BaseGenerator).parser_,
          ppEVar8 !=
          (pPVar6->enums_).vec.
          super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar8 = ppEVar8 + 1) {
        enum_def = *ppEVar8;
        pNVar2 = (enum_def->super_Definition).defined_namespace;
        if ((pNVar2 == *ppNVar10) && ((enum_def->super_Definition).generated == false)) {
          SetNameSpace(this,pNVar2);
          GenEnum(this,enum_def);
        }
      }
      for (ppSVar9 = (pPVar6->structs_).vec.
                     super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pPVar6 = (this->super_BaseGenerator).parser_,
          ppSVar9 !=
          (pPVar6->structs_).vec.
          super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppSVar9 = ppSVar9 + 1) {
        pSVar3 = *ppSVar9;
        pNVar2 = (pSVar3->super_Definition).defined_namespace;
        if (((pNVar2 == *ppNVar10) && (pSVar3->fixed == true)) &&
           ((pSVar3->super_Definition).generated == false)) {
          SetNameSpace(this,pNVar2);
          GenStruct(this,pSVar3);
        }
      }
      for (ppSVar9 = (pPVar6->structs_).vec.
                     super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pPVar6 = (this->super_BaseGenerator).parser_,
          ppSVar9 !=
          (pPVar6->structs_).vec.
          super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppSVar9 = ppSVar9 + 1) {
        pSVar3 = *ppSVar9;
        pNVar2 = (pSVar3->super_Definition).defined_namespace;
        if (((pNVar2 == *ppNVar10) && (pSVar3->fixed == false)) &&
           ((pSVar3->super_Definition).generated == false)) {
          SetNameSpace(this,pNVar2);
          GenTable(this,pSVar3);
          if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
            GenTableObject(this,pSVar3);
          }
        }
      }
      pSVar3 = pPVar6->root_struct_def_;
      if ((pSVar3 != (StructDef *)0x0) &&
         (pNVar2 = (pSVar3->super_Definition).defined_namespace, pNVar2 == *ppNVar10)) {
        SetNameSpace(this,pNVar2);
        GenRootTableFuncs(this,pSVar3);
      }
      pPVar6 = (this->super_BaseGenerator).parser_;
    }
    if (this->cur_name_space_ != (Namespace *)0x0) {
      SetNameSpace(this,(Namespace *)0x0);
    }
    BaseGenerator::GeneratedFileName
              (&local_d0,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
               (this->super_BaseGenerator).file_name_,&((this->super_BaseGenerator).parser_)->opts);
    std::__cxx11::stringbuf::str();
    bVar4 = SaveFile(local_d0._M_dataplus._M_p,(char *)local_b0,local_a8,false);
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    return bVar4;
  }
  __assert_fail("!cur_name_space_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x1b2,"bool flatbuffers::rust::RustGenerator::GenerateOneFile()");
}

Assistant:

bool GenerateOneFile() {
    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";
    code_ += "// @generated";

    assert(!cur_name_space_);

    // Generate imports for the global scope in case no namespace is used
    // in the schema file.
    GenNamespaceImports(0);
    code_ += "";

    // Generate all code in their namespaces, once, because Rust does not
    // permit re-opening modules.
    //
    // TODO(rw): Use a set data structure to reduce namespace evaluations from
    //           O(n**2) to O(n).
    for (auto ns_it = parser_.namespaces_.begin();
         ns_it != parser_.namespaces_.end(); ++ns_it) {
      const auto &ns = *ns_it;

      // Generate code for all the enum declarations.
      for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
           ++it) {
        const auto &enum_def = **it;
        if (enum_def.defined_namespace == ns && !enum_def.generated) {
          SetNameSpace(enum_def.defined_namespace);
          GenEnum(enum_def);
        }
      }

      // Generate code for all structs.
      for (auto it = parser_.structs_.vec.begin();
           it != parser_.structs_.vec.end(); ++it) {
        const auto &struct_def = **it;
        if (struct_def.defined_namespace == ns && struct_def.fixed &&
            !struct_def.generated) {
          SetNameSpace(struct_def.defined_namespace);
          GenStruct(struct_def);
        }
      }

      // Generate code for all tables.
      for (auto it = parser_.structs_.vec.begin();
           it != parser_.structs_.vec.end(); ++it) {
        const auto &struct_def = **it;
        if (struct_def.defined_namespace == ns && !struct_def.fixed &&
            !struct_def.generated) {
          SetNameSpace(struct_def.defined_namespace);
          GenTable(struct_def);
          if (parser_.opts.generate_object_based_api) {
            GenTableObject(struct_def);
          }
        }
      }

      // Generate global helper functions.
      if (parser_.root_struct_def_) {
        auto &struct_def = *parser_.root_struct_def_;
        if (struct_def.defined_namespace != ns) { continue; }
        SetNameSpace(struct_def.defined_namespace);
        GenRootTableFuncs(struct_def);
      }
    }
    if (cur_name_space_) SetNameSpace(nullptr);

    const auto file_path = GeneratedFileName(path_, file_name_, parser_.opts);
    const auto final_code = code_.ToString();
    return SaveFile(file_path.c_str(), final_code, false);
  }